

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qstylesheetstyle_p.cpp
# Opt level: O1

int __thiscall
QStyleSheetStyleCaches::qt_metacall(QStyleSheetStyleCaches *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  
  _id_00 = QObject::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < _id_00) {
    if (_c == InvokeMetaMethod) {
      if (_id_00 < 2) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
      }
      _id_00 = _id_00 + -2;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (_id_00 < 2) {
        *(undefined8 *)*_a = 0;
      }
      _id_00 = _id_00 + -2;
    }
  }
  return _id_00;
}

Assistant:

int QStyleSheetStyleCaches::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    return _id;
}